

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_InitShadeMaps(void)

{
  uchar uVar1;
  int local_20;
  BYTE v;
  int k;
  int a;
  BYTE *table;
  int j;
  int i;
  
  _k = shadetables;
  for (table._4_4_ = 0; table._4_4_ < 0x10; table._4_4_ = table._4_4_ + 1) {
    PalEntry::operator=(&ShadeFakeColormap[table._4_4_].Color,0xffffffff);
    ShadeFakeColormap[table._4_4_].Desaturate = -1;
    ShadeFakeColormap[table._4_4_].Next = (FDynamicColormap *)0x0;
    ShadeFakeColormap[table._4_4_].Maps = _k;
    for (table._0_4_ = 0; (int)table < 0x20; table._0_4_ = (int)table + 1) {
      for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
        uVar1 = MIN<unsigned_char>((uchar)((local_20 + 2) *
                                           (((0x20 - (int)table) * 0x100) / 0x20) *
                                           (0x10 - table._4_4_) + 0x100 >> 0xe),'@');
        _k[local_20] = uVar1;
      }
      _k = _k + 0x100;
    }
  }
  table._4_4_ = 0;
  while( true ) {
    if (0x1ffff < table._4_4_) {
      for (table._4_4_ = 0; table._4_4_ < 0x100; table._4_4_ = table._4_4_ + 1) {
        identitymap[table._4_4_] = (BYTE)table._4_4_;
      }
      return;
    }
    if (0x40 < shadetables[table._4_4_]) break;
    table._4_4_ = table._4_4_ + 1;
  }
  __assert_fail("shadetables[i] <= 64",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_draw.cpp"
                ,0x9c,"void R_InitShadeMaps()");
}

Assistant:

void R_InitShadeMaps()
{
	int i,j;
	// set up shading tables for shaded columns
	// 16 colormap sets, progressing from full alpha to minimum visible alpha

	BYTE *table = shadetables;

	// Full alpha
	for (i = 0; i < 16; ++i)
	{
		ShadeFakeColormap[i].Color = ~0u;
		ShadeFakeColormap[i].Desaturate = ~0u;
		ShadeFakeColormap[i].Next = NULL;
		ShadeFakeColormap[i].Maps = table;

		for (j = 0; j < NUMCOLORMAPS; ++j)
		{
			int a = (NUMCOLORMAPS - j) * 256 / NUMCOLORMAPS * (16-i);
			for (int k = 0; k < 256; ++k)
			{
				BYTE v = (((k+2) * a) + 256) >> 14;
				table[k] = MIN<BYTE> (v, 64);
			}
			table += 256;
		}
	}
	for (i = 0; i < NUMCOLORMAPS*16*256; ++i)
	{
		assert(shadetables[i] <= 64);
	}

	// Set up a guaranteed identity map
	for (i = 0; i < 256; ++i)
	{
		identitymap[i] = i;
	}
}